

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,true>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  int64_t *piVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int64_t lmicros;
  int64_t ldays;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  int64_t *local_78;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = rdata->micros;
      lVar9._0_4_ = rdata->months;
      lVar9._4_4_ = rdata->days;
      lVar13 = (lVar9 >> 0x20) + lVar7 / 86400000000;
      lVar10 = lVar13 % 0x1e;
      lVar9 = (long)(int)(undefined4)lVar9 + lVar13 / 0x1e;
      local_78 = &ldata->micros;
      iVar16 = 0;
      do {
        lVar13._0_4_ = ((interval_t *)(local_78 + -1))->months;
        lVar13._4_4_ = ((interval_t *)(local_78 + -1))->days;
        lVar11 = (lVar13 >> 0x20) + *local_78 / 86400000000;
        lVar12 = lVar11 % 0x1e;
        lVar13 = (long)(int)(undefined4)lVar13 + lVar11 / 0x1e;
        if (lVar13 < lVar9) {
LAB_00355765:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (lVar13 <= lVar9) {
            if (lVar12 < lVar10) goto LAB_00355765;
            bVar4 = lVar7 % 86400000000 <= *local_78 % 86400000000 || lVar10 < lVar12;
          }
        }
        result_data[iVar16] = bVar4;
        iVar16 = iVar16 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar14 = 0;
    do {
      uVar2 = puVar1[uVar14];
      uVar15 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar15 = count;
      }
      uVar3 = uVar15;
      if (uVar2 != 0) {
        uVar3 = uVar5;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar5 < uVar15) {
            lVar7 = rdata->micros;
            lVar12._0_4_ = rdata->months;
            lVar12._4_4_ = rdata->days;
            lVar9 = (lVar12 >> 0x20) + lVar7 / 86400000000;
            lVar13 = lVar9 % 0x1e;
            lVar9 = (long)(int)(undefined4)lVar12 + lVar9 / 0x1e;
            piVar6 = &ldata[uVar5].micros;
            do {
              lVar11._0_4_ = ((interval_t *)(piVar6 + -1))->months;
              lVar11._4_4_ = ((interval_t *)(piVar6 + -1))->days;
              lVar10 = (lVar11 >> 0x20) + *piVar6 / 86400000000;
              lVar12 = lVar10 % 0x1e;
              lVar10 = (long)(int)(undefined4)lVar11 + lVar10 / 0x1e;
              if (lVar10 < lVar9) {
LAB_003554ed:
                bVar4 = false;
              }
              else {
                bVar4 = true;
                if (lVar10 <= lVar9) {
                  if (lVar12 < lVar13) goto LAB_003554ed;
                  bVar4 = lVar7 % 86400000000 <= *piVar6 % 86400000000 || lVar13 < lVar12;
                }
              }
              result_data[uVar5] = bVar4;
              uVar5 = uVar5 + 1;
              piVar6 = piVar6 + 2;
              uVar3 = uVar15;
            } while (uVar15 != uVar5);
          }
        }
        else if (uVar5 < uVar15) {
          piVar6 = &ldata[uVar5].micros;
          uVar8 = 0;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              lVar7._0_4_ = ((interval_t *)(piVar6 + -1))->months;
              lVar7._4_4_ = ((interval_t *)(piVar6 + -1))->days;
              lVar10._0_4_ = rdata->months;
              lVar10._4_4_ = rdata->days;
              lVar9 = (lVar10 >> 0x20) + rdata->micros / 86400000000;
              lVar12 = lVar9 % 0x1e;
              lVar10 = (long)(int)(undefined4)lVar10 + lVar9 / 0x1e;
              lVar9 = (lVar7 >> 0x20) + *piVar6 / 86400000000;
              lVar13 = lVar9 % 0x1e;
              lVar7 = (long)(int)(undefined4)lVar7 + lVar9 / 0x1e;
              if (lVar7 < lVar10) {
LAB_00355628:
                bVar4 = false;
              }
              else {
                bVar4 = true;
                if (lVar7 <= lVar10) {
                  if (lVar13 < lVar12) goto LAB_00355628;
                  bVar4 = rdata->micros % 86400000000 <= *piVar6 % 86400000000 || lVar12 < lVar13;
                }
              }
              result_data[uVar8 + uVar5] = bVar4;
            }
            uVar8 = uVar8 + 1;
            piVar6 = piVar6 + 2;
            uVar3 = uVar15;
          } while (uVar15 - uVar5 != uVar8);
        }
      }
      uVar5 = uVar3;
      uVar14 = uVar14 + 1;
    } while (uVar14 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}